

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall UdpSocketImpl::WriteThread(UdpSocketImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  atomic_uchar *paVar2;
  bool bVar3;
  uint __fd;
  _Elt_pointer ptVar4;
  _Head_base<0UL,_unsigned_char_*,_false> _Var5;
  unsigned_long __n;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ssize_t sVar11;
  BaseSocket *pBVar12;
  int *piVar13;
  ulong uVar14;
  char cVar15;
  unsigned_long __n2_1;
  unsigned_long __n2;
  ulong __n_00;
  bool bVar16;
  socklen_t iLen;
  addrinfo *lstAddr;
  unique_lock<std::mutex> lock;
  _Head_base<0UL,_unsigned_char_*,_false> local_1f8 [2];
  BaseSocket local_1e8;
  pthread_mutex_t *local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  int *local_1b0;
  addrinfo *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  unsigned_long local_180;
  _Head_base<0UL,_unsigned_char_*,_false> _Stack_178;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_170;
  _Any_data *local_168;
  _Any_data *local_160;
  unique_lock<std::mutex> local_158;
  timeval local_148;
  fd_set local_138;
  fd_set local_b8;
  
  local_158._M_device = &this->m_mxWrite;
  local_158._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_158);
  local_158._M_owns = true;
  local_1d8 = (pthread_mutex_t *)&this->m_mxOutDeque;
  local_170 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
               *)&this->m_quOutData;
  local_1b0 = &(this->super_BaseSocketImpl).m_iError;
  local_168 = (_Any_data *)&(this->super_BaseSocketImpl).m_fError;
  local_160 = (_Any_data *)&(this->super_BaseSocketImpl).m_fErrorParam;
LAB_0011c2cf:
  do {
    do {
      if (this->m_bCloseReq == false) {
LAB_0011c2f1:
        if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0) {
          while (((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0 &&
                 (this->m_bCloseReq == false))) {
            std::condition_variable::wait((unique_lock *)&this->m_cv);
          }
        }
      }
      else {
        if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0) goto LAB_0011c966;
        if (this->m_bCloseReq == false) goto LAB_0011c2f1;
      }
    } while ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0);
    local_148.tv_sec = 1;
    local_148.tv_usec = 0;
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    local_138.fds_bits[0] = 0;
    local_138.fds_bits[1] = 0;
    local_138.fds_bits[2] = 0;
    local_138.fds_bits[3] = 0;
    local_138.fds_bits[4] = 0;
    local_138.fds_bits[5] = 0;
    local_138.fds_bits[6] = 0;
    local_138.fds_bits[7] = 0;
    local_138.fds_bits[8] = 0;
    local_138.fds_bits[9] = 0;
    local_138.fds_bits[10] = 0;
    local_138.fds_bits[0xb] = 0;
    local_138.fds_bits[0xc] = 0;
    local_138.fds_bits[0xd] = 0;
    local_138.fds_bits[0xe] = 0;
    local_138.fds_bits[0xf] = 0;
    iVar7 = (this->super_BaseSocketImpl).m_fSock;
    iVar6 = iVar7 + 0x3f;
    if (-1 < iVar7) {
      iVar6 = iVar7;
    }
    uVar14 = 1L << ((byte)iVar7 & 0x3f);
    local_b8.fds_bits[iVar6 >> 6] = local_b8.fds_bits[iVar6 >> 6] | uVar14;
    local_138.fds_bits[iVar6 >> 6] = local_138.fds_bits[iVar6 >> 6] | uVar14;
    iVar7 = select(iVar7 + 1,(fd_set *)0x0,&local_b8,&local_138,&local_148);
    if (iVar7 == 0) {
      if (this->m_bCloseReq != false) {
LAB_0011c966:
        std::unique_lock<std::mutex>::unlock(&local_158);
        if ((*local_1b0 == 0) &&
           (iVar7 = shutdown((this->super_BaseSocketImpl).m_fSock,1), iVar7 != 0)) {
          piVar13 = __errno_location();
          (this->super_BaseSocketImpl).m_iError = *piVar13;
          (this->super_BaseSocketImpl).m_iErrLoc = 4;
        }
        LOCK();
        paVar2 = &(this->super_BaseSocketImpl).m_iShutDownState;
        (paVar2->super___atomic_base<unsigned_char>)._M_i =
             (paVar2->super___atomic_base<unsigned_char>)._M_i | 2;
        UNLOCK();
        paVar2 = &(this->super_BaseSocketImpl).m_iShutDownState;
        LOCK();
        bVar16 = (paVar2->super___atomic_base<unsigned_char>)._M_i == '\x03';
        if (bVar16) {
          (paVar2->super___atomic_base<unsigned_char>)._M_i = '\x0f';
        }
        UNLOCK();
        if (bVar16) {
          iVar7 = (this->super_BaseSocketImpl).m_fSock;
          if (iVar7 != -1) {
            close(iVar7);
          }
          (this->super_BaseSocketImpl).m_fSock = -1;
          if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
              (_Manager_type)0x0 ||
              (this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
          }
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_158);
        return;
      }
      goto LAB_0011c2cf;
    }
    __fd = (this->super_BaseSocketImpl).m_fSock;
    uVar8 = __fd + 0x3f;
    if (-1 < (int)__fd) {
      uVar8 = __fd;
    }
    if (((ulong)local_138.fds_bits[(int)uVar8 >> 6] >> ((ulong)__fd & 0x3f) & 1) != 0) {
      if (*local_1b0 == 0) {
        local_1d0[0] = (long *)CONCAT44(local_1d0[0]._4_4_,4);
        getsockopt(__fd,1,4,local_1b0,(socklen_t *)local_1d0);
        (this->super_BaseSocketImpl).m_iErrLoc = 5;
        bVar16 = (this->super_BaseSocketImpl).m_bStop;
        if (bVar16 == false &&
            (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
            (_Manager_type)0x0) {
          local_1f8[0]._M_head_impl = (uchar *)(this->super_BaseSocketImpl).m_pvUserData;
          local_1a0._M_dataplus._M_p = (pointer)(this->super_BaseSocketImpl).m_pBkRef;
          (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                    (local_160,(BaseSocket **)&local_1a0,&local_1f8[0]._M_head_impl);
        }
        else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                 (_Manager_type)0x0 && bVar16 == false) {
          local_1a0._M_dataplus._M_p = (pointer)(this->super_BaseSocketImpl).m_pBkRef;
          (*(this->super_BaseSocketImpl).m_fError._M_invoker)(local_168,(BaseSocket **)&local_1a0);
        }
      }
      goto LAB_0011c966;
    }
    iVar7 = pthread_mutex_lock(local_1d8);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    ptVar4 = (this->m_quOutData).
             super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    pBVar12 = *(BaseSocket **)
               &(ptVar4->
                super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus;
    paVar1 = &(ptVar4->
              super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2;
    if (pBVar12 == (BaseSocket *)paVar1) {
      local_1a0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_1a0.field_2._8_8_ =
           *(undefined8 *)
            ((long)&(ptVar4->
                    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).
                    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl.field_2 + 8);
    }
    else {
      local_1a0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_1a0._M_dataplus._M_p = (pointer)pBVar12;
    }
    local_1a0._M_string_length =
         (ptVar4->
         super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).
         super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_string_length;
    (ptVar4->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus = (_Alloc_hider)paVar1;
    (ptVar4->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = 0;
    (ptVar4->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0] = '\0';
    local_180 = (ptVar4->
                super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    _Stack_178._M_head_impl =
         (ptVar4->
         super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).
         super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
         ._M_head_impl._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (ptVar4->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
    ._M_head_impl._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false> = (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop_front((deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_170);
    LOCK();
    (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
         (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i - local_180;
    UNLOCK();
    pthread_mutex_unlock(local_1d8);
    local_1a8 = (addrinfo *)0x0;
    cVar15 = (char)&local_1a0;
    lVar9 = std::__cxx11::string::find(cVar15,0x5b);
    lVar10 = std::__cxx11::string::find(cVar15,0x5d);
    if (lVar10 == -1 || lVar9 == -1) {
      lVar9 = std::__cxx11::string::find(cVar15,0x3a);
      bVar16 = true;
      if (lVar9 != -1) {
        std::__cxx11::string::substr((ulong)local_1f8,(ulong)&local_1a0);
        _Var5._M_head_impl = local_1f8[0]._M_head_impl;
        std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_1a0);
        iVar7 = getaddrinfo((char *)_Var5._M_head_impl,(char *)local_1d0[0],(addrinfo *)0x0,
                            &local_1a8);
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
        if ((BaseSocket *)local_1f8[0]._M_head_impl != &local_1e8) {
          operator_delete(local_1f8[0]._M_head_impl,(long)local_1e8._vptr_BaseSocket + 1);
        }
        goto LAB_0011c656;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)local_1f8,(ulong)&local_1a0);
      _Var5._M_head_impl = local_1f8[0]._M_head_impl;
      std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_1a0);
      iVar7 = getaddrinfo((char *)_Var5._M_head_impl,(char *)local_1d0[0],(addrinfo *)0x0,&local_1a8
                         );
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0],local_1c0[0] + 1);
      }
      if ((BaseSocket *)local_1f8[0]._M_head_impl != &local_1e8) {
        operator_delete(local_1f8[0]._M_head_impl,(long)local_1e8._vptr_BaseSocket + 1);
      }
LAB_0011c656:
      bVar16 = true;
      if (iVar7 == 0) {
        sVar11 = sendto((this->super_BaseSocketImpl).m_fSock,_Stack_178._M_head_impl,
                        (long)(int)local_180,0,local_1a8->ai_addr,local_1a8->ai_addrlen);
        freeaddrinfo(local_1a8);
        if ((int)(uint)sVar11 < 1) {
          piVar13 = __errno_location();
          __n = local_180;
          iVar7 = *piVar13;
          *local_1b0 = iVar7;
          if (iVar7 == 0xb) {
            pBVar12 = (BaseSocket *)operator_new__(local_180);
            memset(pBVar12,0,__n);
            local_1f8[0]._M_head_impl = (uchar *)pBVar12;
            if (__n != 0) {
              memmove(pBVar12,_Stack_178._M_head_impl,__n);
            }
            iVar7 = pthread_mutex_lock(local_1d8);
            if (iVar7 != 0) {
              std::__throw_system_error(iVar7);
            }
            LOCK();
            (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                 (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i + local_180;
            UNLOCK();
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                      (local_170,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       local_1f8,&local_180,&local_1a0);
            goto LAB_0011c7b7;
          }
          (this->super_BaseSocketImpl).m_iErrLoc = 6;
          bVar3 = (this->super_BaseSocketImpl).m_bStop;
          if (bVar3 == false &&
              (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            local_1d0[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
            local_1f8[0]._M_head_impl = (uchar *)(this->super_BaseSocketImpl).m_pBkRef;
            (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                      (local_160,(BaseSocket **)local_1f8,local_1d0);
            bVar16 = true;
          }
          else {
            bVar16 = true;
            if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                (_Manager_type)0x0 && bVar3 == false) {
              local_1f8[0]._M_head_impl = (uchar *)(this->super_BaseSocketImpl).m_pBkRef;
              (*(this->super_BaseSocketImpl).m_fError._M_invoker)
                        (local_168,(BaseSocket **)local_1f8);
            }
          }
        }
        else {
          uVar14 = (ulong)((uint)sVar11 & 0x7fffffff);
          __n_00 = local_180 - uVar14;
          if (uVar14 <= local_180 && __n_00 != 0) {
            pBVar12 = (BaseSocket *)operator_new__(__n_00);
            memset(pBVar12,0,__n_00);
            local_1f8[0]._M_head_impl = (uchar *)pBVar12;
            memmove(pBVar12,_Stack_178._M_head_impl + uVar14,__n_00);
            iVar7 = pthread_mutex_lock(local_1d8);
            if (iVar7 != 0) {
              std::__throw_system_error(iVar7);
            }
            LOCK();
            (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                 (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i + (local_180 - uVar14)
            ;
            UNLOCK();
            local_1d0[0] = (long *)(local_180 - uVar14);
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string&>
                      (local_170,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       local_1f8,(unsigned_long *)local_1d0,&local_1a0);
LAB_0011c7b7:
            pthread_mutex_unlock(local_1d8);
            if ((BaseSocket *)local_1f8[0]._M_head_impl != (BaseSocket *)0x0) {
              operator_delete__(local_1f8[0]._M_head_impl);
            }
          }
          bVar16 = false;
        }
      }
    }
    if (_Stack_178._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Stack_178._M_head_impl);
    }
    _Stack_178._M_head_impl = (uchar *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (bVar16) goto LAB_0011c966;
  } while( true );
}

Assistant:

void UdpSocketImpl::WriteThread()
{

    unique_lock<mutex> lock(m_mxWrite);

    while (m_bCloseReq == false || m_atOutBytes != 0)
    {
        if (m_bCloseReq == false && m_atOutBytes == 0)
            m_cv.wait(lock, [&]() noexcept { return m_atOutBytes == 0 ? m_bCloseReq : true; });

        if (m_atOutBytes != 0)
        {
            fd_set writefd{}, errorfd{};
            struct timeval timeout{};

            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            FD_ZERO(&writefd);
            FD_ZERO(&errorfd);

            FD_SET(m_fSock, &writefd);
            FD_SET(m_fSock, &errorfd);

            if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) == 0)
            {
                if (m_bCloseReq == false) continue;
                break;
            }

            if (FD_ISSET(m_fSock, &errorfd))
            {
                if (m_iError == 0)
                {
                    socklen_t iLen = sizeof(m_iError);
                    getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                    m_iErrLoc = 5;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                }
                break;
            }

            m_mxOutDeque.lock();
            DATA data = move(m_quOutData.front());
            m_quOutData.pop_front();
            m_atOutBytes -= BUFLEN(data);
            m_mxOutDeque.unlock();

            struct addrinfo *lstAddr = nullptr;
            const size_t nPosS = ADDRESS(data).find('[');
            const size_t nPosE = ADDRESS(data).find(']');
            if (nPosS != string::npos && nPosE != string::npos)
            {
                if (::getaddrinfo(ADDRESS(data).substr(nPosS + 1, nPosE - 1).c_str(), ADDRESS(data).substr(nPosE + 2).c_str(), nullptr, &lstAddr) != 0)
                    break;    // we return 0, because of a wrong address
            }
            else
            {
                const size_t nPos = ADDRESS(data).find(':');
                if (nPos != string::npos)
                {
                    if (::getaddrinfo(ADDRESS(data).substr(0, nPos).c_str(), ADDRESS(data).substr(nPos + 1).c_str(), nullptr, &lstAddr) != 0)
                        break;    // we return 0, because of a wrong address
                }
                else
                    break;    // we return 0, because of a wrong address
            }

            const uint32_t transferred = ::sendto(m_fSock, reinterpret_cast<const char*>(&BUFFER(data)[0]), static_cast<int>(BUFLEN(data)), 0, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen));
            ::freeaddrinfo(lstAddr);
            if (static_cast<int32_t>(transferred) <= 0)
            {
                m_iError = WSAGetLastError();
                if (m_iError != WSAEWOULDBLOCK)
                {
                    m_iErrLoc = 6;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                    break;
                }
                // Put the not send bytes back into the que if it is not a SSL connection. A SSL connection has the bytes still available
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data));
                copy_n(&BUFFER(data)[0], BUFLEN(data), &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += BUFLEN(data);
                m_quOutData.emplace_front(move(tmp), BUFLEN(data), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
            else if (transferred < BUFLEN(data)) // Less bytes send as buffer size, we put the rast back in your que
            {
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data) - transferred);
                copy_n(&BUFFER(data)[transferred], BUFLEN(data) - transferred, &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += (BUFLEN(data) - transferred);
                m_quOutData.emplace_front(move(tmp), (BUFLEN(data) - transferred), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
        }
    }

    lock.unlock();

    // if we get out of the while loop, the stop request was send or we have an error
    if (m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_SEND) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
            m_iErrLoc = 4;
        }
    }
    m_iShutDownState |= 2;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}